

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_unknown_chunks(spng_ctx *ctx,spng_unknown_chunk *chunks,uint32_t n_chunks)

{
  uint local_2c;
  uint32_t i;
  int ret;
  uint32_t n_chunks_local;
  spng_unknown_chunk *chunks_local;
  spng_ctx *ctx_local;
  
  if (n_chunks == 0) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx == (spng_ctx *)0x0) || (chunks == (spng_unknown_chunk *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      for (local_2c = 0; local_2c < n_chunks; local_2c = local_2c + 1) {
        if (0x7fffffff < chunks[local_2c].length) {
          return 0x4f;
        }
        if ((chunks[local_2c].length != 0) && (chunks[local_2c].data == (void *)0x0)) {
          return 1;
        }
        if ((1 < chunks[local_2c].location - SPNG_AFTER_IHDR) &&
           (chunks[local_2c].location != SPNG_AFTER_IDAT)) {
          return 0x10;
        }
      }
      if ((((uint)ctx->stored >> 0x10 & 1) != 0) && (((uint)ctx->user >> 0x10 & 1) == 0)) {
        for (local_2c = 0; local_2c < ctx->n_chunks; local_2c = local_2c + 1) {
          spng__free(ctx,ctx->chunk_list[local_2c].data);
        }
        spng__free(ctx,ctx->chunk_list);
      }
      ctx->chunk_list = chunks;
      ctx->n_chunks = n_chunks;
      ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xfffeffff | 0x10000);
      ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xfffeffff | 0x10000);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_unknown_chunks(spng_ctx *ctx, struct spng_unknown_chunk *chunks, uint32_t n_chunks)
{
    if(!n_chunks) return 1;
    SPNG_SET_CHUNK_BOILERPLATE(chunks);

    uint32_t i;
    for(i=0; i < n_chunks; i++)
    {
        if(chunks[i].length > spng_u32max) return SPNG_ECHUNK_STDLEN;
        if(chunks[i].length && chunks[i].data == NULL) return 1;

        switch(chunks[i].location)
        {
            case SPNG_AFTER_IHDR:
            case SPNG_AFTER_PLTE:
            case SPNG_AFTER_IDAT:
            break;
            default: return SPNG_ECHUNK_POS;
        }
    }

    if(ctx->stored.unknown && !ctx->user.unknown)
    {
        for(i=0; i < ctx->n_chunks; i++)
        {
            spng__free(ctx, ctx->chunk_list[i].data);
        }
        spng__free(ctx, ctx->chunk_list);
    }

    ctx->chunk_list = chunks;
    ctx->n_chunks = n_chunks;

    ctx->stored.unknown = 1;
    ctx->user.unknown = 1;

    return 0;
}